

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

natwm_error parser_read_item(parser *parser,char **key_result,config_value **value_result)

{
  config_value *pcVar1;
  undefined8 in_R9;
  undefined8 uVar2;
  config_value *config_value;
  char *value;
  char *key;
  config_value **ppcStack_28;
  natwm_error err;
  config_value **value_result_local;
  char **key_result_local;
  parser *parser_local;
  
  uVar2 = 0x108db9;
  key._4_4_ = 0x20;
  value = (char *)0x0;
  ppcStack_28 = value_result;
  value_result_local = (config_value **)key_result;
  key_result_local = &parser->buffer;
  key._4_4_ = parser_read_key(parser,&value,(size_t *)0x0);
  parser_local._4_4_ = key._4_4_;
  if (key._4_4_ == NO_ERROR) {
    config_value = (config_value *)0x0;
    key._4_4_ = parser_read_value((parser *)key_result_local,(char **)&config_value,(size_t *)0x0);
    if (key._4_4_ == NO_ERROR) {
      pcVar1 = parser_parse_value((parser *)key_result_local,(char *)config_value);
      if (pcVar1 == (config_value *)0x0) {
        internal_logger(natwm_logger,LEVEL_ERROR,"Failed to save \'%s\' - Line %zu",value,
                        key_result_local[3],in_R9,uVar2);
        free(value);
        free(config_value);
        parser_local._4_4_ = GENERIC_ERROR;
      }
      else {
        *value_result_local = (config_value *)value;
        *ppcStack_28 = pcVar1;
        parser_local._4_4_ = NO_ERROR;
      }
    }
    else {
      free(value);
      parser_local._4_4_ = key._4_4_;
    }
  }
  return parser_local._4_4_;
}

Assistant:

enum natwm_error parser_read_item(struct parser *parser, char **key_result,
                                  struct config_value **value_result)
{
        enum natwm_error err = GENERIC_ERROR;
        char *key = NULL;

        err = parser_read_key(parser, &key, NULL);

        if (err != NO_ERROR) {
                return err;
        }

        char *value = NULL;

        err = parser_read_value(parser, &value, NULL);

        if (err != NO_ERROR) {
                free(key);

                return err;
        }

        struct config_value *config_value = parser_parse_value(parser, value);

        if (config_value == NULL) {
                LOG_ERROR(natwm_logger, "Failed to save '%s' - Line %zu", key, parser->line_num);

                free(key);
                free(value);

                return GENERIC_ERROR;
        }

        *key_result = key;
        *value_result = config_value;

        return NO_ERROR;
}